

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  json_str jsonStr;
  long *local_78;
  long local_70;
  long local_68 [2];
  string local_58;
  json_str local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"hello","");
  json_str::json_str(&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,local_38.value._M_dataplus._M_p,
             local_38.value._M_dataplus._M_p + local_38.value._M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_78,local_70);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  local_38.super_json_element._vptr_json_element = (_func_int **)&PTR_get_type_0012d9c0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.value._M_dataplus._M_p != &local_38.value.field_2) {
    operator_delete(local_38.value._M_dataplus._M_p,local_38.value.field_2._M_allocated_capacity + 1
                   );
  }
  return 0;
}

Assistant:

int main() {
    json_str jsonStr = str_value_of("hello");
    cout << jsonStr.str_value() << endl;
    return 0;
}